

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::trim(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)str,0x1586c0);
  std::__cxx11::string::find_last_not_of((char *)str,0x1586c0);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim( std::string const& str ) {
        static char const* whitespaceChars = "\n\r\t ";
        std::string::size_type start = str.find_first_not_of( whitespaceChars );
        std::string::size_type end = str.find_last_not_of( whitespaceChars );

        return start != std::string::npos ? str.substr( start, 1+end-start ) : std::string();
    }